

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::HttpRequestHeader::ParseLine
          (HttpRequestHeader *this,string *line,int lineNumber)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  int in_EDX;
  HttpHeader *in_RSI;
  HttpHeader *in_RDI;
  int minor;
  int major;
  string temp;
  size_t foundVersion;
  size_t foundSecondSpace;
  size_t foundResource;
  size_t foundFirstSpace;
  size_t foundMethod;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  if (in_EDX != 0) {
    bVar2 = HttpHeader::ParseLine
                      (in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    return bVar2;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    return false;
  }
  lVar4 = std::__cxx11::string::find_first_not_of((char)in_RSI,0x20);
  if (lVar4 == -1) {
    return false;
  }
  local_30 = std::__cxx11::string::find((char)in_RSI,0x20);
  if (local_30 != -1) {
    local_38 = std::__cxx11::string::find_first_not_of((char)in_RSI,0x20);
    if (local_38 == -1) {
      return false;
    }
    local_40 = std::__cxx11::string::find((char)in_RSI,0x20);
    if (local_40 != -1) {
      local_48 = std::__cxx11::string::find_first_not_of((char)in_RSI,0x20);
      if (local_48 != -1) {
        std::__cxx11::string::substr((ulong)local_68,(ulong)in_RSI);
        std::__cxx11::string::operator=((string *)(in_RDI + 1),local_68);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::substr((ulong)local_88,(ulong)in_RSI);
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[1].m_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left,local_88
                  );
        std::__cxx11::string::~string(local_88);
        std::__cxx11::string::substr((ulong)local_a8,(ulong)in_RSI);
        lVar4 = std::__cxx11::string::find(local_a8,0x218238);
        if ((lVar4 == 0) && (lVar4 = std::__cxx11::string::size(), lVar4 == 8)) {
          pcVar5 = (char *)std::__cxx11::string::at((ulong)local_a8);
          cVar1 = *pcVar5;
          pcVar5 = (char *)std::__cxx11::string::at((ulong)local_a8);
          HttpHeader::SetVersion(in_RDI,cVar1 + -0x30,*pcVar5 + -0x30);
          local_1 = true;
        }
        else {
          local_1 = false;
        }
        std::__cxx11::string::~string(local_a8);
        return local_1;
      }
      return false;
    }
    return false;
  }
  return false;
}

Assistant:

bool HttpRequestHeader::ParseLine(const string& line, int lineNumber) {

    // if not 'request line', just let base class parse
    if ( lineNumber != 0 )
        return HttpHeader::ParseLine(line, lineNumber);

    // fail if empty line
    if ( line.empty() )
        return false;

    // walk through request line, storing positions
    //    GET /path/to/resource HTTP/1.1
    //    ^  ^^                ^^
    const size_t foundMethod = line.find_first_not_of(Constants::SPACE_CHAR); // skip any leading whitespace
    if ( foundMethod == string::npos ) return false;
    const size_t foundFirstSpace = line.find(Constants::SPACE_CHAR, foundMethod+1);
    if ( foundFirstSpace == string::npos ) return false;
    const size_t foundResource = line.find_first_not_of(Constants::SPACE_CHAR, foundFirstSpace+1);
    if ( foundResource == string::npos ) return false;
    const size_t foundSecondSpace = line.find(Constants::SPACE_CHAR, foundResource+1);
    if ( foundSecondSpace == string::npos ) return false;
    const size_t foundVersion= line.find_first_not_of(Constants::SPACE_CHAR, foundSecondSpace+1);
    if ( foundVersion == string::npos ) return false;

    // parse out method & resource
    m_method   = line.substr(foundMethod,   foundFirstSpace  - foundMethod);
    m_resource = line.substr(foundResource, foundSecondSpace - foundResource);

    // parse out version numbers
    const string temp = line.substr(foundVersion);
    if ( (temp.find(Constants::HTTP_STRING) != 0) || (temp.size() != 8) )
        return false;
    const int major = static_cast<int>(temp.at(5) - '0');
    const int minor = static_cast<int>(temp.at(7) - '0');
    SetVersion(major, minor);

    // if we get here, return success
    return true;
}